

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O0

QStringView QMakeInternal::IoUtils::fileName(QString *fileName)

{
  QChar c;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar1;
  QString *this;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  QLatin1Char in_stack_ffffffffffffffbf;
  QStringView *in_stack_ffffffffffffffc0;
  QStringView *this_00;
  undefined1 in_stack_ffffffffffffffd0 [16];
  QLatin1Char local_1b [3];
  QString local_18;
  
  local_18.d.size = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_18;
  QStringView::QStringView<QString,_true>
            (in_stack_ffffffffffffffc0,
             (QString *)
             CONCAT17(in_stack_ffffffffffffffbf.ch,
                      CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
  this_00 = in_RDI;
  QLatin1Char::QLatin1Char(local_1b,'/');
  QChar::QChar<QLatin1Char,_true>((QChar *)this,in_stack_ffffffffffffffbf);
  c.ucs._1_1_ = in_stack_ffffffffffffffbf.ch;
  c.ucs._0_1_ = in_stack_ffffffffffffffbe;
  QString::lastIndexOf(this,c,(CaseSensitivity)((ulong)in_RDI >> 0x20));
  QVar1 = QStringView::mid(this_00,in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18.d.size) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QStringView IoUtils::fileName(const QString &fileName)
{
    return QStringView(fileName).mid(fileName.lastIndexOf(QLatin1Char('/')) + 1);
}